

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

vector<Token,_std::allocator<Token>_> *
Tokenizer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *str,
                   NumberType *numberType)

{
  NumericConstantChar NVar1;
  pointer pTVar2;
  TokenType TVar3;
  char value1;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  NumericConstantChar *pNVar7;
  char current;
  string identifier;
  NumericConstantChar local_c9;
  ulong local_c8;
  undefined1 local_c0 [48];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  NumericConstantChar *local_70;
  long local_68;
  NumericConstantChar local_60;
  undefined1 uStack_5f;
  undefined6 uStack_5e;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = 0;
  if (str->_M_string_length != 0) {
    do {
      uVar6 = local_c8;
      NVar1 = (str->_M_dataplus)._M_p[local_c8];
      local_c9 = NVar1;
      iVar4 = isspace((int)(char)NVar1);
      if (iVar4 == 0) {
        if (NVar1 == 0x2c) {
          Token::Token((Token *)local_c0,COMMA);
          std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                    (__return_storage_ptr__,(Token *)local_c0);
LAB_00125c54:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_p != &local_80) {
            operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
          }
          if ((NumericConstantChar *)local_c0._8_8_ == (NumericConstantChar *)0x0)
          goto LAB_00125c87;
          uVar6 = local_c0._24_8_ - local_c0._8_8_;
          pNVar7 = (NumericConstantChar *)local_c0._8_8_;
        }
        else {
          if (NVar1 == 0x29) {
            Token::Token((Token *)local_c0,RIGHT_PARENTHESIS);
            std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                      (__return_storage_ptr__,(Token *)local_c0);
            goto LAB_00125c54;
          }
          if (NVar1 == 0x28) {
            Token::Token((Token *)local_c0,LEFT_PARENTHESIS);
            std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                      (__return_storage_ptr__,(Token *)local_c0);
            goto LAB_00125c54;
          }
          iVar4 = (*numberType->_vptr_NumberType[5])
                            (numberType,str,(ulong)(uint)(int)(char)NVar1,uVar6);
          NVar1 = local_c9;
          if ((char)iVar4 != '\0') {
            (*numberType->_vptr_NumberType[6])((Token *)local_c0,numberType,str,&local_c9,&local_c8)
            ;
            std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                      (__return_storage_ptr__,(Token *)local_c0);
            goto LAB_00125c54;
          }
          iVar4 = isalpha((int)(char)local_c9);
          if (iVar4 == 0) {
            pTVar2 = (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            if (pTVar2 != (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>
                          )._M_impl.super__Vector_impl_data._M_start) {
              TVar3 = Token::type(pTVar2 + -1);
              if (TVar3 == OPERATOR) {
                local_c0[0] = Token::charValue((__return_storage_ptr__->
                                               super__Vector_base<Token,_std::allocator<Token>_>).
                                               _M_impl.super__Vector_impl_data._M_finish + -1);
                sVar5 = std::
                        _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        ::count((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)(anonymous_namespace)::twoCharOps,(key_type_conflict *)local_c0);
                if (sVar5 != 0) {
                  value1 = Token::charValue((__return_storage_ptr__->
                                            super__Vector_base<Token,_std::allocator<Token>_>).
                                            _M_impl.super__Vector_impl_data._M_finish + -1);
                  Token::Token((Token *)local_c0,TWO_CHAR_OPERATOR,value1,local_c9);
                  pTVar2 = (__return_storage_ptr__->
                           super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                  pTVar2[-1].mType = local_c0[0];
                  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
                  _M_move_assign(&pTVar2[-1].mNumericValue.mChars,local_c0 + 8);
                  pTVar2[-1].mNumericValue.mBase = local_c0[0x20];
                  pTVar2[-1].mCharValue = local_c0[0x28];
                  pTVar2[-1].mCharValue2 = local_c0[0x29];
                  std::__cxx11::string::operator=
                            ((string *)&pTVar2[-1].mIdentifier,(string *)&local_90);
                  goto LAB_00125c54;
                }
              }
            }
            Token::Token((Token *)local_c0,OPERATOR,local_c9);
            std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                      (__return_storage_ptr__,(Token *)local_c0);
            goto LAB_00125c54;
          }
          local_70 = &local_60;
          local_60 = NVar1;
          local_68 = 1;
          uStack_5f = 0;
          while (uVar6 = local_c8 + 1, uVar6 < str->_M_string_length) {
            local_c9 = (str->_M_dataplus)._M_p[uVar6];
            if (9 < (int)(char)local_c9 - 0x30U) {
              iVar4 = isalpha((int)(char)local_c9);
              if (iVar4 == 0) break;
            }
            std::__cxx11::string::push_back((char)&local_70);
            local_c8 = uVar6;
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_70,local_70 + local_68);
          Token::Token((Token *)local_c0,&local_50);
          std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                    (__return_storage_ptr__,(Token *)local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_p != &local_80) {
            operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
          }
          if ((NumericConstantChar *)local_c0._8_8_ != (NumericConstantChar *)0x0) {
            operator_delete((void *)local_c0._8_8_,local_c0._24_8_ - local_c0._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_70 == &local_60) goto LAB_00125c87;
          uVar6 = CONCAT62(uStack_5e,CONCAT11(uStack_5f,local_60)) + 1;
          pNVar7 = local_70;
        }
        operator_delete(pNVar7,uVar6);
      }
LAB_00125c87:
      local_c8 = local_c8 + 1;
    } while (local_c8 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::tokenize(std::string str, NumberType& numberType) {
	std::vector<Token> tokens;
	for (std::size_t i = 0; i < str.size(); i++) {
		char current = str[i];

		//Skip whitespaces
		if (isspace(current)) {
			continue;
		}

		//Parenthesis
		if (current == '(') {
			tokens.push_back({ TokenType::LEFT_PARENTHESIS });
			continue;
		}

		if (current == ')') {
			tokens.push_back({ TokenType::RIGHT_PARENTHESIS });
			continue;
		}

		//Comma
		if (current == ',') {
			tokens.push_back({ TokenType::COMMA });
			continue;
		}

		//Number
		if (numberType.isStartOfNumber(str, current, i)) {
			tokens.push_back(numberType.parseNumber(str, current, i));
			continue;
		}

		//Identifier
		if (isalpha(current)) {
			std::string identifier { current };

			while (true) {
				std::size_t next = i + 1;

				if (next >= str.size()) {
					break;
				}

				current = str[next];

				if (!(isdigit(current) || isalpha(current))) {
					break;
				}

				identifier += current;
				i = next;
			}

			tokens.push_back(Token(identifier));
			continue;
		}

		//Operator
		if (tokens.size() > 0 && tokens.back().type() == TokenType::OPERATOR
			&& twoCharOps.count(tokens.back().charValue()) > 0) {
			//If the previous token is an operator and the current one also is, upgrade to a two-op char
			tokens.back() = { TokenType::TWO_CHAR_OPERATOR, tokens.back().charValue(), current };
		} else {
			tokens.push_back({ TokenType::OPERATOR, current });
		}
	}

	return tokens;
}